

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall
f8n::runtime::MessageQueue::Debounce(MessageQueue *this,IMessagePtr *message,int64_t delayMs)

{
  int iVar1;
  uint uVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  shared_ptr<f8n::runtime::IMessage> local_30;
  int64_t local_20;
  int64_t delayMs_local;
  IMessagePtr *message_local;
  MessageQueue *this_local;
  
  local_20 = delayMs;
  delayMs_local = (int64_t)message;
  message_local = (IMessagePtr *)this;
  peVar3 = std::
           __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)message);
  iVar1 = (*peVar3->_vptr_IMessage[2])();
  peVar3 = std::
           __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)message);
  uVar2 = (*peVar3->_vptr_IMessage[3])();
  (*(this->super_IMessageQueue)._vptr_IMessageQueue[3])
            (this,CONCAT44(extraout_var,iVar1),(ulong)uVar2);
  std::shared_ptr<f8n::runtime::IMessage>::shared_ptr(&local_30,message);
  (*(this->super_IMessageQueue)._vptr_IMessageQueue[2])(this,&local_30,local_20);
  std::shared_ptr<f8n::runtime::IMessage>::~shared_ptr(&local_30);
  return;
}

Assistant:

void MessageQueue::Debounce(IMessagePtr message, int64_t delayMs) {
    Remove(message->Target(), message->Type());
    Post(message, delayMs);
}